

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O1

void __thiscall cppcms::impl::file_server::load_mime_types(file_server *this,string *file_name)

{
  long lVar1;
  char cVar2;
  istream *piVar3;
  mapped_type *pmVar4;
  string ext;
  string mime;
  string line;
  ifstream inp;
  istringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  undefined1 *local_418;
  undefined8 local_410;
  undefined1 local_408 [16];
  char *local_3f8;
  long local_3f0;
  char local_3e8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  long local_3b8 [4];
  byte abStack_398 [488];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::ifstream::ifstream(local_3b8,(file_name->_M_dataplus)._M_p,_S_in);
  if ((abStack_398[*(long *)(local_3b8[0] + -0x18)] & 5) == 0) {
    local_3f8 = local_3e8;
    local_3f0 = 0;
    local_3e8[0] = '\0';
    lVar1 = *(long *)(local_3b8[0] + -0x18);
    if ((abStack_398[lVar1] & 2) == 0) {
      do {
        cVar2 = std::ios::widen((char)&local_438 + (char)lVar1 + -0x80);
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_3b8,(string *)&local_3f8,cVar2);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
        if ((local_3f0 != 0) && (*local_3f8 != '#')) {
          std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_3f8,_S_in);
          local_418 = local_408;
          local_410 = 0;
          local_408[0] = 0;
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          local_438._M_string_length = 0;
          local_438.field_2._M_local_buf[0] = '\0';
          piVar3 = std::operator>>((istream *)local_1b0,(string *)&local_418);
          if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
            while (piVar3 = std::operator>>((istream *)local_1b0,(string *)&local_438),
                  ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
              std::operator+(&local_3d8,".",&local_438);
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](&this->mime_,&local_3d8);
              std::__cxx11::string::_M_assign((string *)pmVar4);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                operator_delete(local_3d8._M_dataplus._M_p);
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p);
          }
          if (local_418 != local_408) {
            operator_delete(local_418);
          }
          std::__cxx11::istringstream::~istringstream(local_1b0);
          std::ios_base::~ios_base(local_138);
        }
        lVar1 = *(long *)(local_3b8[0] + -0x18);
      } while ((abStack_398[lVar1] & 2) == 0);
    }
    if (local_3f8 != local_3e8) {
      operator_delete(local_3f8);
    }
  }
  std::ifstream::~ifstream(local_3b8);
  return;
}

Assistant:

void file_server::load_mime_types(std::string file_name)
{
	booster::nowide::ifstream inp(file_name.c_str());
	if(!inp) {
		return;
	}
	std::string line;
	while(!inp.eof() && getline(inp,line)) {
		if(line.empty() || line[0]=='#')
			continue;
		std::istringstream ss(line);
		std::string mime;
		std::string ext;
		if(ss>>mime) {
			while(ss>>ext) {
				mime_["."+ext]=mime;
			}
		}
	}
}